

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int str_comp_filenames(char *a,char *b)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  int result;
  int local_1c;
  char *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    bVar3 = false;
    if (*local_10 != '\0') {
      bVar3 = *local_18 != '\0';
    }
    if (!bVar3) break;
    if (((('/' < *local_10) && (*local_10 < ':')) && ('/' < *local_18)) && (*local_18 < ':')) {
      local_1c = 0;
      do {
        if (local_1c == 0) {
          local_1c = (int)*local_10 - (int)*local_18;
        }
        local_10 = local_10 + 1;
        local_18 = local_18 + 1;
        bVar3 = false;
        if ((('/' < *local_10) && (bVar3 = false, *local_10 < ':')) &&
           (bVar3 = false, '/' < *local_18)) {
          bVar3 = *local_18 < ':';
        }
      } while (bVar3);
      if (('/' < *local_10) && (*local_10 < ':')) {
        return 1;
      }
      if (('/' < *local_18) && (*local_18 < ':')) {
        return -1;
      }
      if (local_1c != 0) {
        return local_1c;
      }
    }
    iVar1 = tolower((int)*local_10);
    iVar2 = tolower((int)*local_18);
    if (iVar1 != iVar2) break;
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
  }
  iVar1 = tolower((int)*local_10);
  iVar2 = tolower((int)*local_18);
  return iVar1 - iVar2;
}

Assistant:

int str_comp_filenames(const char *a, const char *b)
{
	int result;

	for(; *a && *b; ++a, ++b)
	{
		if(*a >= '0' && *a <= '9' && *b >= '0' && *b <= '9')
		{
			result = 0;
			do
			{
				if(!result)
					result = *a - *b;
				++a; ++b;
			}
			while(*a >= '0' && *a <= '9' && *b >= '0' && *b <= '9');

			if(*a >= '0' && *a <= '9')
				return 1;
			else if(*b >= '0' && *b <= '9')
				return -1;
			else if(result)
				return result;
		}

		if(tolower(*a) != tolower(*b))
			break;
	}
	return tolower(*a) - tolower(*b);
}